

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void makeliteral_chr(strbuf *b,termchar *c,unsigned_long *state)

{
  ulong uVar1;
  byte bVar2;
  BinarySink *bs;
  
  uVar1 = c->chr;
  if ((uVar1 & 0xffffffffffffff80) == *state) {
    bVar2 = (byte)uVar1 & 0x7f;
  }
  else {
    bs = b->binarysink_;
    if (0x3fff < uVar1) {
      if (uVar1 < 0x200000) {
        bVar2 = (byte)(uVar1 >> 0x10) | 0xc0;
      }
      else {
        if (0xfffffff < uVar1) {
          BinarySink_put_byte(bs,0xf0);
          BinarySink_put_uint32(bs,c->chr);
          goto LAB_00111bb4;
        }
        BinarySink_put_byte(bs,(byte)(uVar1 >> 0x18) | 0xe0);
        bVar2 = *(byte *)((long)&c->chr + 2);
      }
      BinarySink_put_byte(bs,bVar2);
      BinarySink_put_uint16(bs,(ulong)(ushort)c->chr);
      goto LAB_00111bb4;
    }
    BinarySink_put_byte(bs,(byte)(uVar1 >> 8) | 0x80);
    bVar2 = (byte)c->chr;
  }
  BinarySink_put_byte(b->binarysink_,bVar2);
LAB_00111bb4:
  *state = c->chr & 0xffffffffffffff00;
  return;
}

Assistant:

static void makeliteral_chr(strbuf *b, termchar *c, unsigned long *state)
{
    /*
     * My encoding for characters is UTF-8-like, in that it stores
     * 7-bit ASCII in one byte and uses high-bit-set bytes as
     * introducers to indicate a longer sequence. However, it's
     * unlike UTF-8 in that it doesn't need to be able to
     * resynchronise, and therefore I don't want to waste two bits
     * per byte on having recognisable continuation characters.
     * Also I don't want to rule out the possibility that I may one
     * day use values 0x80000000-0xFFFFFFFF for interesting
     * purposes, so unlike UTF-8 I need a full 32-bit range.
     * Accordingly, here is my encoding:
     *
     * 00000000-0000007F: 0xxxxxxx (but see below)
     * 00000080-00003FFF: 10xxxxxx xxxxxxxx
     * 00004000-001FFFFF: 110xxxxx xxxxxxxx xxxxxxxx
     * 00200000-0FFFFFFF: 1110xxxx xxxxxxxx xxxxxxxx xxxxxxxx
     * 10000000-FFFFFFFF: 11110ZZZ xxxxxxxx xxxxxxxx xxxxxxxx xxxxxxxx
     *
     * (`Z' is like `x' but is always going to be zero since the
     * values I'm encoding don't go above 2^32. In principle the
     * five-byte form of the encoding could extend to 2^35, and
     * there could be six-, seven-, eight- and nine-byte forms as
     * well to allow up to 64-bit values to be encoded. But that's
     * completely unnecessary for these purposes!)
     *
     * The encoding as written above would be very simple, except
     * that 7-bit ASCII can occur in several different ways in the
     * terminal data; sometimes it crops up in the D800 page
     * (CSET_ASCII) but at other times it's in the 0000 page (real
     * Unicode). Therefore, this encoding is actually _stateful_:
     * the one-byte encoding of 00-7F actually indicates `reuse the
     * upper three bytes of the last character', and to encode an
     * absolute value of 00-7F you need to use the two-byte form
     * instead.
     */
    if ((c->chr & ~0x7F) == *state) {
        put_byte(b, (unsigned char)(c->chr & 0x7F));
    } else if (c->chr < 0x4000) {
        put_byte(b, (unsigned char)(((c->chr >> 8) & 0x3F) | 0x80));
        put_byte(b, (unsigned char)(c->chr & 0xFF));
    } else if (c->chr < 0x200000) {
        put_byte(b, (unsigned char)(((c->chr >> 16) & 0x1F) | 0xC0));
        put_uint16(b, c->chr & 0xFFFF);
    } else if (c->chr < 0x10000000) {
        put_byte(b, (unsigned char)(((c->chr >> 24) & 0x0F) | 0xE0));
        put_byte(b, (unsigned char)((c->chr >> 16) & 0xFF));
        put_uint16(b, c->chr & 0xFFFF);
    } else {
        put_byte(b, 0xF0);
        put_uint32(b, c->chr);
    }
    *state = c->chr & ~0xFF;
}